

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.c
# Opt level: O0

void display_file(char *fname,boolean complain)

{
  dlb *dp;
  long lVar1;
  char *buf_00;
  int fsize;
  char *buf;
  dlb *fp;
  boolean complain_local;
  char *fname_local;
  
  dp = dlb_fopen(fname,"r");
  if (dp == (dlb *)0x0) {
    if (complain == '\0') {
      if (program_state.something_worth_saving != 0) {
        doredraw();
      }
    }
    else {
      pline("Cannot open \"%s\".",fname);
    }
  }
  else {
    dlb_fseek(dp,0,2);
    lVar1 = dlb_ftell(dp);
    dlb_fseek(dp,0,0);
    buf_00 = (char *)malloc((long)(int)lVar1);
    dlb_fread(buf_00,(int)lVar1,1,dp);
    dlb_fclose(dp);
    (*windowprocs.win_display_buffer)(buf_00,complain);
    free(buf_00);
  }
  return;
}

Assistant:

void display_file(const char *fname, boolean complain)
{
	dlb *fp;
	char *buf;
	int fsize;

	fp = dlb_fopen(fname, "r");
	if (!fp) {
	    if (complain) {
		pline("Cannot open \"%s\".", fname);
	    } else if (program_state.something_worth_saving) doredraw();
	} else {
	    dlb_fseek(fp, 0, SEEK_END);
	    fsize = dlb_ftell(fp);
	    dlb_fseek(fp, 0, SEEK_SET);
	    
	    buf = malloc(fsize);
	    dlb_fread(buf, fsize, 1, fp);
	    
	    dlb_fclose(fp);
	    
	    display_buffer(buf, complain);
	    
	    free(buf);
	}
}